

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::Arguments::~Arguments(Arguments *this)

{
  long lVar1;
  pointer ppcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppcVar2 = (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 !=
      (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      free(*ppcVar2);
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 !=
             (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppcVar2 = (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar2 == (pointer)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(ppcVar2,(long)(this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2)
    ;
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Arguments() {
    for (std::vector<char*>::iterator i = args_.begin(); i != args_.end();
         ++i) {
      free(*i);
    }
  }